

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress2(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  ZSTD_CCtx *code;
  size_t result;
  size_t iPos;
  size_t oPos;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  oPos = srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstCapacity;
  dstCapacity_local = (size_t)dst;
  dst_local = cctx;
  ZSTD_CCtx_reset(cctx,ZSTD_reset_session_only);
  iPos = 0;
  result = 0;
  code = (ZSTD_CCtx *)
         ZSTD_compressStream2_simpleArgs
                   ((ZSTD_CCtx *)dst_local,(void *)dstCapacity_local,(size_t)src_local,&iPos,
                    (void *)srcSize_local,oPos,&result,ZSTD_e_end);
  uVar1 = ERR_isError((size_t)code);
  cctx_local = code;
  if (uVar1 == 0) {
    if (code == (ZSTD_CCtx *)0x0) {
      cctx_local = (ZSTD_CCtx *)iPos;
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffba;
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        if (ZSTD_isError(result)) return result;
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            return ERROR(dstSize_tooSmall);
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}